

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O3

bool duckdb::FileSystem::HasGlob(string *str)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  
  uVar1 = str->_M_string_length;
  if (uVar1 == 0) {
    bVar4 = false;
  }
  else {
    bVar4 = true;
    uVar2 = 1;
    do {
      uVar3 = (byte)(str->_M_dataplus)._M_p[uVar2 - 1] - 0x2a;
      if ((uVar3 < 0x32) && ((0x2000000200001U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
        return bVar4;
      }
      bVar4 = uVar2 < uVar1;
      bVar5 = uVar2 != uVar1;
      uVar2 = uVar2 + 1;
    } while (bVar5);
  }
  return bVar4;
}

Assistant:

bool FileSystem::HasGlob(const string &str) {
	for (idx_t i = 0; i < str.size(); i++) {
		switch (str[i]) {
		case '*':
		case '?':
		case '[':
			return true;
		default:
			break;
		}
	}
	return false;
}